

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

void __thiscall
kj::
Table<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Entry,_kj::HashIndex<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Callbacks>_>
::eraseImpl(Table<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Entry,_kj::HashIndex<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Callbacks>_>
            *this,size_t pos)

{
  size_t oldPos;
  undefined8 *puVar1;
  undefined8 *puVar2;
  Entry *pEVar3;
  HashIndex<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Callbacks>
  *indexObj;
  ArrayPtr<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Entry> table;
  ArrayPtr<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Entry> table_00;
  
  pEVar3 = *(Entry **)this;
  table.size_ = (*(long *)(this + 8) - (long)pEVar3 >> 3) * -0x3333333333333333;
  table.ptr = pEVar3;
  HashIndex<kj::HashMap<capnp::_::RawSchema*,kj::Vector<capnp::_::RawSchema*>>::Callbacks>::
  erase<kj::HashMap<capnp::_::RawSchema*,kj::Vector<capnp::_::RawSchema*>>::Entry,capnp::_::RawSchema*&>
            ((HashIndex<kj::HashMap<capnp::_::RawSchema*,kj::Vector<capnp::_::RawSchema*>>::Callbacks>
              *)(this + 0x20),table,pos,(RawSchema **)((long)&pEVar3->key + pos * 0x28));
  pEVar3 = *(Entry **)this;
  table_00.size_ = (*(long *)(this + 8) - (long)pEVar3 >> 3) * -0x3333333333333333;
  oldPos = table_00.size_ - 1;
  if (oldPos != pos) {
    table_00.ptr = pEVar3;
    HashIndex<kj::HashMap<capnp::_::RawSchema*,kj::Vector<capnp::_::RawSchema*>>::Callbacks>::
    move<kj::HashMap<capnp::_::RawSchema*,kj::Vector<capnp::_::RawSchema*>>::Entry,capnp::_::RawSchema*&>
              ((HashIndex<kj::HashMap<capnp::_::RawSchema*,kj::Vector<capnp::_::RawSchema*>>::Callbacks>
                *)(this + 0x20),table_00,oldPos,pos,(RawSchema **)((long)pEVar3 + oldPos * 0x28));
    puVar1 = (undefined8 *)(*(long *)this + oldPos * 0x28);
    puVar2 = (undefined8 *)(*(long *)this + pos * 0x28);
    *puVar2 = *puVar1;
    ArrayBuilder<capnp::_::RawSchema_*>::operator=
              ((ArrayBuilder<capnp::_::RawSchema_*> *)(puVar2 + 1),
               (ArrayBuilder<capnp::_::RawSchema_*> *)(puVar1 + 1));
  }
  ArrayBuilder<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Entry>::
  removeLast((ArrayBuilder<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Entry>
              *)this);
  return;
}

Assistant:

void Table<Row, Indexes...>::eraseImpl(size_t pos) {
  Impl<>::erase(*this, pos, rows[pos]);
  size_t back = rows.size() - 1;
  if (pos != back) {
    Impl<>::move(*this, back, pos, rows[back]);
    rows[pos] = kj::mv(rows[back]);
  }
  rows.removeLast();
}